

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

void __thiscall capnp::JsonCodec::encode(JsonCodec *this,Reader *input,Type type,Builder output)

{
  undefined1 (*pauVar1) [12];
  byte bVar2;
  ushort uVar3;
  word *pwVar4;
  double dVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined2 *puVar8;
  Builder output_00;
  Field field_00;
  Field field_01;
  Field field_02;
  Field field_03;
  Field field_04;
  Field field_05;
  Field field_06;
  Field field_07;
  Builder output_01;
  Builder output_02;
  Builder output_03;
  long lVar9;
  uint uVar10;
  undefined1 *puVar11;
  undefined4 uVar12;
  ReaderFor<bool> RVar13;
  bool bVar14;
  Which WVar15;
  undefined7 extraout_var;
  ElementCount EVar16;
  ulong uVar17;
  char *pcVar18;
  void *__dest;
  unsigned_long i;
  size_t sVar19;
  Iterator __end3;
  size_t __n;
  ulong uVar20;
  anon_union_64_1_a8c68091_for_NullableValue<capnp::StructSchema::Field>_2 *paVar21;
  bool bVar22;
  ReaderFor<Text> RVar23;
  ReaderFor<DynamicEnum> RVar24;
  ArrayPtr<const_char> value;
  Reader RVar25;
  Type type_00;
  Reader RVar26;
  Reader value_00;
  Reader value_01;
  Reader value_02;
  uint fieldCount;
  size_t pos;
  String result;
  Field field;
  Builder outField_2;
  Array<bool> hasField_heap;
  Builder outField;
  Builder array;
  ReaderFor<capnp::DynamicStruct> structValue;
  Builder object;
  bool hasField_stack [32];
  undefined1 local_56c [4];
  ulong local_568;
  uint local_55c;
  Maybe<capnp::StructSchema::Field> local_558;
  undefined1 local_508 [24];
  CapTableReader *pCStack_4f0;
  WirePointer *local_4e8;
  WirePointer *pWStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  StructBuilder local_4c8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  ulong uStack_490;
  undefined8 *local_488;
  Reader local_478;
  JsonCodec *local_440;
  undefined1 local_438 [80];
  ulong local_3e8;
  Type local_3e0;
  PointerBuilder local_3d0;
  Schema local_3b8;
  CapTableBuilder *pCStack_3b0;
  SegmentBuilder *local_3a8;
  CapTableReader *pCStack_3a0;
  WirePointer *local_398;
  WirePointer *pWStack_390;
  StructDataBitCount local_388;
  StructPointerCount SStack_384;
  undefined2 uStack_382;
  int iStack_380;
  undefined4 uStack_37c;
  Schema local_378;
  CapTableBuilder *pCStack_370;
  SegmentBuilder *local_368;
  CapTableBuilder *pCStack_360;
  WirePointer *local_358;
  void *pvStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  RawBrandedSchema *local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  ReaderFor<DynamicStruct> local_2f8;
  Schema local_2c0;
  uint uStack_2b8;
  undefined4 uStack_2b4;
  StructReader local_2b0;
  StructBuilder local_280;
  StructBuilder local_258;
  StructBuilder local_230;
  ListBuilder local_208;
  StructBuilder local_1e0;
  Reader local_1b8;
  Reader local_170;
  undefined1 local_128 [32];
  Reader local_108;
  Reader local_c0;
  Reader local_78;
  
  local_3e0.field_4 = type.field_4;
  local_3e0._0_8_ = type._0_8_;
  kj::
  Table<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Entry,kj::HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>>
  ::find<0ul,capnp::Type&>
            ((Table<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Entry,kj::HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>>
              *)local_438,(Type *)&((this->impl).ptr)->typeHandlers);
  uVar6 = local_438._0_8_;
  if ((Exception *)local_438._0_8_ != (Exception *)0x0) {
    pwVar4 = (((SegmentReader *)local_438._0_8_)->ptr).ptr;
    DynamicValue::Reader::Reader(&local_170,input);
    (**(code **)pwVar4->content)(pwVar4,this,&local_170);
    DynamicValue::Reader::~Reader(&local_170);
    if ((Exception *)uVar6 != (Exception *)0x0) {
      return;
    }
  }
  WVar15 = LIST;
  if (local_3e0.listDepth == '\0') {
    WVar15 = local_3e0.baseType;
  }
  switch(WVar15) {
  case VOID:
    *(undefined2 *)CONCAT44(output._builder.data._4_4_,output._builder.data._0_4_) = 0;
    break;
  case BOOL:
    RVar13 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply(input);
    puVar8 = (undefined2 *)CONCAT44(output._builder.data._4_4_,output._builder.data._0_4_);
    *puVar8 = 1;
    *(byte *)(puVar8 + 1) = *(byte *)(puVar8 + 1) & 0xfe | RVar13;
    break;
  case INT8:
  case INT16:
  case INT32:
  case UINT8:
  case UINT16:
  case UINT32:
    dVar5 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply(input);
    goto LAB_00177a56;
  case INT64:
    local_508._0_8_ = DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply(input);
    kj::str<long>((String *)&local_558,(long *)local_508);
    lVar9 = CONCAT17(local_558.ptr.field_1.field1[7],local_558.ptr.field_1._0_7_);
    if (lVar9 == 0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = (char *)CONCAT17(local_558.ptr._7_1_,
                                 CONCAT61(local_558.ptr._1_6_,local_558.ptr.isSet));
    }
    value_01.super_StringPtr.content.size_ = lVar9 + (ulong)(lVar9 == 0);
    *(undefined2 *)CONCAT44(output._builder.data._4_4_,output._builder.data._0_4_) = 3;
    local_438._4_4_ = output._builder.segment._4_4_;
    local_438._0_4_ = output._builder.segment._0_4_;
    local_438._12_4_ = output._builder.capTable._4_4_;
    local_438._8_4_ = output._builder.capTable._0_4_;
    local_438._16_8_ = CONCAT44(output._builder.pointers._4_4_,(uint)output._builder.pointers);
    value_01.super_StringPtr.content.ptr = pcVar18;
    capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_438,value_01);
    lVar9 = CONCAT17(local_558.ptr._7_1_,CONCAT61(local_558.ptr._1_6_,local_558.ptr.isSet));
    if (lVar9 != 0) {
      uVar6 = CONCAT17(local_558.ptr.field_1.field1[7],local_558.ptr.field_1._0_7_);
      local_558.ptr.isSet = false;
      local_558.ptr._1_6_ = 0;
      local_558.ptr._7_1_ = 0;
      local_558.ptr.field_1._0_7_ = 0;
      local_558.ptr.field_1.field1[7] = 0;
      (*(code *)**(undefined8 **)
                  CONCAT44(local_558.ptr.field_1._12_4_,local_558.ptr.field_1.value.index))
                ((undefined8 *)
                 CONCAT44(local_558.ptr.field_1._12_4_,local_558.ptr.field_1.value.index),lVar9,1,
                 uVar6,uVar6,0);
    }
    break;
  case UINT64:
    local_508._0_8_ = DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply(input);
    kj::str<unsigned_long>((String *)&local_558,(unsigned_long *)local_508);
    lVar9 = CONCAT17(local_558.ptr.field_1.field1[7],local_558.ptr.field_1._0_7_);
    if (lVar9 == 0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = (char *)CONCAT17(local_558.ptr._7_1_,
                                 CONCAT61(local_558.ptr._1_6_,local_558.ptr.isSet));
    }
    value_02.super_StringPtr.content.size_ = lVar9 + (ulong)(lVar9 == 0);
    *(undefined2 *)CONCAT44(output._builder.data._4_4_,output._builder.data._0_4_) = 3;
    local_438._4_4_ = output._builder.segment._4_4_;
    local_438._0_4_ = output._builder.segment._0_4_;
    local_438._12_4_ = output._builder.capTable._4_4_;
    local_438._8_4_ = output._builder.capTable._0_4_;
    local_438._16_8_ = CONCAT44(output._builder.pointers._4_4_,(uint)output._builder.pointers);
    value_02.super_StringPtr.content.ptr = pcVar18;
    capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_438,value_02);
    lVar9 = CONCAT17(local_558.ptr._7_1_,CONCAT61(local_558.ptr._1_6_,local_558.ptr.isSet));
    if (lVar9 != 0) {
      uVar6 = CONCAT17(local_558.ptr.field_1.field1[7],local_558.ptr.field_1._0_7_);
      local_558.ptr.isSet = false;
      local_558.ptr._1_6_ = 0;
      local_558.ptr._7_1_ = 0;
      local_558.ptr.field_1._0_7_ = 0;
      local_558.ptr.field_1.field1[7] = 0;
      (*(code *)**(undefined8 **)
                  CONCAT44(local_558.ptr.field_1._12_4_,local_558.ptr.field_1.value.index))
                ((undefined8 *)
                 CONCAT44(local_558.ptr.field_1._12_4_,local_558.ptr.field_1.value.index),lVar9,1,
                 uVar6,uVar6,0);
    }
    break;
  case FLOAT32:
  case FLOAT64:
    dVar5 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply(input);
    if (INFINITY <= dVar5) {
      *(undefined2 *)CONCAT44(output._builder.data._4_4_,output._builder.data._0_4_) = 3;
      local_438._4_4_ = output._builder.segment._4_4_;
      local_438._0_4_ = output._builder.segment._0_4_;
      local_438._12_4_ = output._builder.capTable._4_4_;
      local_438._8_4_ = output._builder.capTable._0_4_;
      local_438._16_8_ = CONCAT44(output._builder.pointers._4_4_,(uint)output._builder.pointers);
      value_00.super_StringPtr.content.size_ = 9;
      value_00.super_StringPtr.content.ptr = "Infinity";
      capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_438,value_00);
      return;
    }
    if (-INFINITY < dVar5) {
      if (!NAN(dVar5) && !NAN(dVar5)) goto LAB_00177a56;
      pcVar18 = "NaN";
      sVar19 = 4;
    }
    else {
      pcVar18 = "-Infinity";
      sVar19 = 10;
    }
    value.size_ = sVar19;
    value.ptr = pcVar18;
LAB_00177e5b:
    json::Value::Builder::setString(&output,(Reader)value);
    break;
  case TEXT:
    RVar23 = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply(input);
    kj::heapString((String *)&local_558,RVar23.super_StringPtr.content.size_ - 1);
    __n = RVar23.super_StringPtr.content.size_ - 1;
    if (__n != 0) {
      __dest = (void *)CONCAT17(local_558.ptr.field_1.field1[7],local_558.ptr.field_1._0_7_);
      if (__dest != (void *)0x0) {
        __dest = (void *)CONCAT17(local_558.ptr._7_1_,
                                  CONCAT61(local_558.ptr._1_6_,local_558.ptr.isSet));
      }
      memcpy(__dest,RVar23.super_StringPtr.content.ptr,__n);
    }
    lVar9 = CONCAT17(local_558.ptr.field_1.field1[7],local_558.ptr.field_1._0_7_);
    if (lVar9 == 0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = (char *)CONCAT17(local_558.ptr._7_1_,
                                 CONCAT61(local_558.ptr._1_6_,local_558.ptr.isSet));
    }
    RVar26.super_StringPtr.content.size_ = lVar9 + (ulong)(lVar9 == 0);
    *(undefined2 *)CONCAT44(output._builder.data._4_4_,output._builder.data._0_4_) = 3;
    local_438._4_4_ = output._builder.segment._4_4_;
    local_438._0_4_ = output._builder.segment._0_4_;
    local_438._12_4_ = output._builder.capTable._4_4_;
    local_438._8_4_ = output._builder.capTable._0_4_;
    local_438._16_8_ = CONCAT44(output._builder.pointers._4_4_,(uint)output._builder.pointers);
    RVar26.super_StringPtr.content.ptr = pcVar18;
    capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_438,RVar26);
    lVar9 = CONCAT17(local_558.ptr._7_1_,CONCAT61(local_558.ptr._1_6_,local_558.ptr.isSet));
    if (lVar9 != 0) {
      uVar6 = CONCAT17(local_558.ptr.field_1.field1[7],local_558.ptr.field_1._0_7_);
      local_558.ptr.isSet = false;
      local_558.ptr._1_6_ = 0;
      local_558.ptr._7_1_ = 0;
      local_558.ptr.field_1._0_7_ = 0;
      local_558.ptr.field_1.field1[7] = 0;
      (*(code *)**(undefined8 **)
                  CONCAT44(local_558.ptr.field_1._12_4_,local_558.ptr.field_1.value.index))
                ((undefined8 *)
                 CONCAT44(local_558.ptr.field_1._12_4_,local_558.ptr.field_1.value.index),lVar9,1,
                 uVar6,uVar6,0);
    }
    break;
  case DATA:
    RVar25 = DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply(input);
    *(undefined2 *)CONCAT44(output._builder.data._4_4_,output._builder.data._0_4_) = 4;
    local_558.ptr.isSet = SUB41(output._builder.segment._0_4_,0);
    local_558.ptr._1_6_ =
         SUB86(CONCAT44(output._builder.segment._4_4_,output._builder.segment._0_4_) >> 8,0);
    local_558.ptr._7_1_ = SUB41((uint)output._builder.segment._4_4_ >> 0x18,0);
    local_558.ptr.field_1._0_7_ =
         (undefined7)CONCAT44(output._builder.capTable._4_4_,output._builder.capTable._0_4_);
    local_558.ptr.field_1.field1[7] = (undefined1)((uint)output._builder.capTable._4_4_ >> 0x18);
    local_558.ptr.field_1.value.index = (uint)output._builder.pointers;
    local_558.ptr.field_1._12_4_ = output._builder.pointers._4_4_;
    capnp::_::PointerBuilder::initStructList
              ((ListBuilder *)local_438,(PointerBuilder *)&local_558,
               (ElementCount)RVar25.super_ArrayPtr<const_unsigned_char>.size_,(StructSize)0x10002);
    if (RVar25.super_ArrayPtr<const_unsigned_char>.size_ != 0) {
      sVar19 = 0;
      do {
        capnp::_::ListBuilder::getStructElement
                  ((StructBuilder *)&local_558,(ListBuilder *)local_438,(ElementCount)sVar19);
        bVar2 = RVar25.super_ArrayPtr<const_unsigned_char>.ptr[sVar19];
        *(undefined2 *)CONCAT44(local_558.ptr.field_1._12_4_,local_558.ptr.field_1.value.index) = 2;
        *(double *)
         ((undefined2 *)CONCAT44(local_558.ptr.field_1._12_4_,local_558.ptr.field_1.value.index) + 4
         ) = (double)bVar2;
        sVar19 = sVar19 + 1;
      } while (RVar25.super_ArrayPtr<const_unsigned_char>.size_ != sVar19);
    }
    break;
  case LIST:
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)local_438,input);
    type_00 = (Type)Type::asList(&local_3e0);
    *(undefined2 *)CONCAT44(output._builder.data._4_4_,output._builder.data._0_4_) = 4;
    local_508._4_4_ = output._builder.segment._4_4_;
    local_508._0_4_ = output._builder.segment._0_4_;
    local_508._8_8_ = CONCAT44(output._builder.capTable._4_4_,output._builder.capTable._0_4_);
    local_508._16_8_ = CONCAT44(output._builder.pointers._4_4_,(uint)output._builder.pointers);
    capnp::_::PointerBuilder::initStructList
              ((ListBuilder *)&local_558,(PointerBuilder *)local_508,local_438._40_4_,
               (StructSize)0x10002);
    if ((local_438._40_8_ & 0xffffffff) != 0) {
      uVar17 = 0;
      do {
        DynamicList::Reader::operator[](&local_78,(Reader *)local_438,(uint)uVar17);
        capnp::_::ListBuilder::getStructElement(&local_1e0,(ListBuilder *)&local_558,(uint)uVar17);
        output_00._builder.capTable._0_4_ = (int)local_1e0.capTable;
        output_00._builder.segment = local_1e0.segment;
        output_00._builder.capTable._4_4_ = (int)((ulong)local_1e0.capTable >> 0x20);
        output_00._builder.data._0_4_ = (int)local_1e0.data;
        output_00._builder.data._4_4_ = (int)((ulong)local_1e0.data >> 0x20);
        output_00._builder.pointers._0_4_ = (int)local_1e0.pointers;
        output_00._builder.pointers._4_4_ = (int)((ulong)local_1e0.pointers >> 0x20);
        output_00._builder.dataSize = local_1e0.dataSize;
        output_00._builder.pointerCount = local_1e0.pointerCount;
        output_00._builder._38_2_ = local_1e0._38_2_;
        encode(this,&local_78,type_00,output_00);
        DynamicValue::Reader::~Reader(&local_78);
        uVar17 = uVar17 + 1;
      } while ((local_438._40_8_ & 0xffffffff) != uVar17);
    }
    break;
  case ENUM:
    RVar24 = DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply(input);
    local_508._0_8_ = RVar24.schema.super_Schema.raw;
    local_508._8_2_ = RVar24.value;
    DynamicEnum::getEnumerant
              ((Maybe<capnp::EnumSchema::Enumerant> *)local_438,(DynamicEnum *)local_508);
    uVar7 = local_438._32_8_;
    uVar6 = local_438._24_8_;
    if (local_438[0] ==
        (Table<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Entry,kj::HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>>
         )0x1) {
      local_558.ptr.field_1.field1[0x2f] = (undefined1)local_438._56_8_;
      local_558.ptr.field_1._48_7_ = SUB87(local_438._56_8_,1);
      local_558.ptr.field_1.field1[0x37] = (undefined1)local_438._64_4_;
      local_558.ptr.field_1._56_7_ = (undefined7)(CONCAT44(local_438._68_4_,local_438._64_4_) >> 8);
      local_558.ptr.field_1.field1[0x1f] = (undefined1)local_438._40_8_;
      local_558.ptr.field_1._32_7_ = SUB87(local_438._40_8_,1);
      local_558.ptr.field_1.field1[0x27] = (undefined1)local_438._48_8_;
      local_558.ptr.field_1._40_7_ = SUB87(local_438._48_8_,1);
      local_558.ptr.field_1.field1[0xf] = (undefined1)local_438._24_8_;
      local_558.ptr.field_1._16_7_ = SUB87(local_438._24_8_,1);
      local_558.ptr.field_1.field1[0x17] = (undefined1)local_438._32_8_;
      local_558.ptr.field_1._24_7_ = SUB87(local_438._32_8_,1);
      local_558.ptr._7_1_ = SUB81(local_438._8_8_,0);
      local_558.ptr.field_1._0_7_ = SUB87(local_438._8_8_,1);
      local_558.ptr.field_1.field1[7] = (undefined1)local_438._16_8_;
      local_558.ptr.field_1.value.index = SUB84(local_438._16_8_,1);
      local_558.ptr.field_1._12_3_ = SUB83(local_438._16_8_,5);
      local_438._32_8_ = local_438._56_8_;
      local_438._16_8_ = local_438._40_8_;
      local_438._24_8_ = local_438._48_8_;
      local_438._0_8_ = uVar6;
      local_438._8_8_ = uVar7;
      value = (ArrayPtr<const_char>)capnp::schema::Enumerant::Reader::getName((Reader *)local_438);
      goto LAB_00177e5b;
    }
    dVar5 = (double)(ushort)local_508._8_2_;
LAB_00177a56:
    *(undefined2 *)CONCAT44(output._builder.data._4_4_,output._builder.data._0_4_) = 2;
    *(double *)((undefined2 *)CONCAT44(output._builder.data._4_4_,output._builder.data._0_4_) + 4) =
         dVar5;
    break;
  case STRUCT:
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_2f8,input);
    local_558.ptr.isSet = local_2f8.schema.super_Schema.raw._0_1_;
    local_558.ptr._1_6_ = local_2f8.schema.super_Schema.raw._1_6_;
    local_558.ptr._7_1_ = local_2f8.schema.super_Schema.raw._7_1_;
    StructSchema::getNonUnionFields((FieldSubset *)local_438,(StructSchema *)&local_558);
    uVar12 = local_438._64_4_;
    uStack_490 = (ulong)(uint)local_438._64_4_;
    if (uStack_490 < 0x21) {
      local_498 = (undefined1 *)0x0;
      uStack_490 = 0;
      local_488 = (undefined8 *)0x0;
    }
    else {
      local_498 = (undefined1 *)
                  kj::_::HeapArrayDisposer::allocateImpl
                            (1,uStack_490,uStack_490,(_func_void_void_ptr *)0x0,
                             (_func_void_void_ptr *)0x0);
      local_488 = &kj::_::HeapArrayDisposer::instance;
    }
    local_4a0 = local_498;
    if ((uint)uVar12 < 0x21) {
      local_4a0 = local_128;
    }
    local_56c = (undefined1  [4])0x0;
    uVar17 = (ulong)(uint)local_438._64_4_;
    if (uVar17 != 0) {
      uVar20 = 0;
      do {
        uVar6 = local_438._0_8_;
        uVar3 = *(ushort *)(local_438._56_8_ + uVar20 * 2);
        capnp::_::ListReader::getStructElement(&local_2b0,(ListReader *)(local_438 + 8),(uint)uVar3)
        ;
        local_2c0.raw = (RawBrandedSchema *)uVar6;
        field_00.index._0_2_ = uVar3;
        field_00.parent.super_Schema.raw = (Schema)(Schema)uVar6;
        field_00.index._2_2_ = 0;
        field_00._12_4_ = uStack_2b4;
        field_00.proto._reader.segment._0_4_ = (int)local_2b0.segment;
        field_00.proto._reader.segment._4_4_ = (int)((ulong)local_2b0.segment >> 0x20);
        field_00.proto._reader.capTable._0_4_ = (int)local_2b0.capTable;
        field_00.proto._reader.capTable._4_4_ = (int)((ulong)local_2b0.capTable >> 0x20);
        field_00.proto._reader.data = local_2b0.data;
        field_00.proto._reader.pointers = local_2b0.pointers;
        field_00.proto._reader.dataSize = local_2b0.dataSize;
        field_00.proto._reader.pointerCount = local_2b0.pointerCount;
        field_00.proto._reader._38_2_ = local_2b0._38_2_;
        field_00.proto._reader.nestingLimit = local_2b0.nestingLimit;
        field_00.proto._reader._44_4_ = local_2b0._44_4_;
        uStack_2b8 = (uint)uVar3;
        bVar14 = DynamicStruct::Reader::has(&local_2f8,field_00,((this->impl).ptr)->hasMode);
        local_4a0[uVar20] = bVar14;
        local_56c = (undefined1  [4])((int)local_56c + (uint)bVar14);
        uVar20 = uVar20 + 1;
      } while (uVar17 != uVar20);
    }
    DynamicStruct::Reader::which(&local_558,&local_2f8);
    if (local_558.ptr.isSet == true) {
      field_01.proto._reader.data._7_1_ = local_558.ptr.field_1.field1[0x27];
      field_01.proto._reader.data._0_7_ = local_558.ptr.field_1._32_7_;
      field_01.proto._reader.pointers._7_1_ = local_558.ptr.field_1.field1[0x2f];
      field_01.proto._reader.pointers._0_7_ = local_558.ptr.field_1._40_7_;
      field_01.proto._reader._39_1_ = local_558.ptr.field_1.field1[0x37];
      field_01.proto._reader.dataSize = local_558.ptr.field_1.value.proto._reader.dataSize;
      field_01.proto._reader.pointerCount = local_558.ptr.field_1.value.proto._reader.pointerCount;
      field_01.proto._reader._38_1_ = local_558.ptr.field_1.field1[0x36];
      field_01.proto._reader._47_1_ = local_558.ptr.field_1.field1[0x3f];
      field_01.proto._reader._40_7_ = local_558.ptr.field_1._56_7_;
      field_01.parent.super_Schema.raw._4_4_ =
           (int)(CONCAT17(local_558.ptr.field_1.field1[7],local_558.ptr.field_1._0_7_) >> 0x20);
      field_01.parent.super_Schema.raw._0_4_ = (int)local_558.ptr.field_1._0_7_;
      field_01.index = local_558.ptr.field_1.value.index;
      field_01._12_4_ = local_558.ptr.field_1._12_4_;
      field_01.proto._reader.segment._0_4_ = (int)local_558.ptr.field_1._16_7_;
      field_01.proto._reader.segment._4_4_ =
           (int)(CONCAT17(local_558.ptr.field_1.field1[0x17],local_558.ptr.field_1._16_7_) >> 0x20);
      field_01.proto._reader.capTable._0_4_ = (int)local_558.ptr.field_1._24_7_;
      field_01.proto._reader.capTable._4_4_ =
           (int)(CONCAT17(local_558.ptr.field_1.field1[0x1f],local_558.ptr.field_1._24_7_) >> 0x20);
      bVar14 = DynamicStruct::Reader::has(&local_2f8,field_01,((this->impl).ptr)->hasMode);
      bVar22 = true;
      if (0x1f < local_558.ptr.field_1.value.proto._reader.dataSize) {
        bVar22 = *(short *)(CONCAT17(local_558.ptr.field_1.field1[0x27],local_558.ptr.field_1._32_7_
                                    ) + 2) != -1;
      }
      local_55c = (uint)CONCAT71(extraout_var,bVar14) ^ 1;
      if ((bVar22 | bVar14) == 1) {
        local_56c = (undefined1  [4])((int)local_56c + 1);
      }
      else if (local_558.ptr.isSet == true) {
        local_558.ptr.isSet = false;
      }
    }
    else {
      local_55c = 0;
    }
    *(undefined2 *)CONCAT44(output._builder.data._4_4_,output._builder.data._0_4_) = 5;
    local_508._4_4_ = output._builder.segment._4_4_;
    local_508._0_4_ = output._builder.segment._0_4_;
    local_508._8_8_ = CONCAT44(output._builder.capTable._4_4_,output._builder.capTable._0_4_);
    local_508._16_8_ = CONCAT44(output._builder.pointers._4_4_,(uint)output._builder.pointers);
    capnp::_::PointerBuilder::initStructList
              (&local_208,(PointerBuilder *)local_508,(ElementCount)local_56c,(StructSize)0x20000);
    local_568 = 0;
    local_3e8 = (ulong)(uint)local_438._64_4_;
    if (local_3e8 != 0) {
      uVar17 = 0;
      local_440 = this;
      do {
        uVar7 = local_438._0_8_;
        uVar6 = local_508._8_8_;
        uVar3 = *(ushort *)(local_438._56_8_ + uVar17 * 2);
        local_508._10_2_ = 0;
        local_508._8_2_ = uVar3;
        uVar10 = local_508._8_4_;
        local_508._8_8_ = uVar6;
        capnp::_::ListReader::getStructElement
                  ((StructReader *)(local_508 + 0x10),(ListReader *)(local_438 + 8),(uint)uVar3);
        local_508._0_8_ = uVar7;
        local_508._8_8_ = CONCAT44(local_508._12_4_,uVar10);
        paVar21 = (anon_union_64_1_a8c68091_for_NullableValue<capnp::StructSchema::Field>_2 *)0x0;
        if (local_558.ptr.isSet != false) {
          paVar21 = &local_558.ptr.field_1;
        }
        if ((local_558.ptr.isSet == true) && (local_558.ptr.field_1.value.index < uVar3)) {
          EVar16 = (ElementCount)local_568;
          local_568 = local_568 + 1;
          capnp::_::ListBuilder::getStructElement((StructBuilder *)&local_478,&local_208,EVar16);
          if (local_558.ptr.field_1.value.proto._reader.pointerCount == 0) {
            local_4c8.pointers._0_4_ = 0x7fffffff;
            local_4c8.capTable = (CapTableBuilder *)0x0;
            local_4c8.data = (void *)0x0;
            local_4c8.segment = (SegmentBuilder *)0x0;
          }
          else {
            local_4c8.data =
                 (void *)CONCAT17(local_558.ptr.field_1.field1[0x2f],local_558.ptr.field_1._40_7_);
            local_4c8.capTable =
                 (CapTableBuilder *)
                 CONCAT17(local_558.ptr.field_1.field1[0x1f],local_558.ptr.field_1._24_7_);
            local_4c8.segment =
                 (SegmentBuilder *)
                 CONCAT17(local_558.ptr.field_1.field1[0x17],local_558.ptr.field_1._16_7_);
            local_4c8.pointers._0_4_ = local_558.ptr.field_1.value.proto._reader.nestingLimit;
          }
          RVar26 = capnp::_::PointerReader::getBlob<capnp::Text>
                             ((PointerReader *)&local_4c8,(void *)0x0,0);
          local_4c8.segment = (SegmentBuilder *)local_478._reader.segment;
          local_4c8.capTable = (CapTableBuilder *)local_478._reader.capTable;
          local_4c8.data = local_478._reader.pointers;
          capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_4c8,RVar26);
          if ((char)local_55c == '\0') {
            local_308 = *(undefined8 *)*(undefined1 (*) [12])((long)paVar21 + 0x30);
            uStack_300 = *(undefined8 *)(*(undefined1 (*) [12])((long)paVar21 + 0x30) + 8);
            local_318 = *(undefined8 *)(*(undefined1 (*) [12])((long)paVar21 + 0x18) + 8);
            uStack_310 = *(undefined8 *)(*(undefined1 (*) [12])((long)paVar21 + 0x24) + 4);
            local_328 = *(undefined8 *)(*(undefined1 (*) [12])((long)paVar21 + 0xc) + 4);
            uStack_320 = *(undefined8 *)*(undefined1 (*) [12])((long)paVar21 + 0x18);
            local_338 = (paVar21->value).parent.super_Schema.raw;
            uStack_330 = *(undefined8 *)((long)paVar21 + 8);
            uVar6 = *(undefined8 *)(*(undefined1 (*) [12])((long)paVar21 + 0xc) + 4);
            uVar7 = *(undefined8 *)*(undefined1 (*) [12])((long)paVar21 + 0x18);
            pauVar1 = (undefined1 (*) [12])((long)paVar21 + 0x30);
            field_02._12_4_ = (int)((ulong)*(undefined8 *)((long)paVar21 + 8) >> 0x20);
            field_02._0_12_ = *(undefined1 (*) [12])paVar21;
            field_02.proto._reader.segment._0_4_ = (int)uVar6;
            field_02.proto._reader.segment._4_4_ = (int)((ulong)uVar6 >> 0x20);
            field_02.proto._reader.capTable._0_4_ = (int)uVar7;
            field_02.proto._reader.capTable._4_4_ = (int)((ulong)uVar7 >> 0x20);
            field_02.proto._reader.data =
                 (void *)*(undefined8 *)(*(undefined1 (*) [12])((long)paVar21 + 0x18) + 8);
            field_02.proto._reader.pointers =
                 (WirePointer *)*(undefined8 *)(*(undefined1 (*) [12])((long)paVar21 + 0x24) + 4);
            field_02.proto._reader.dataSize = *(StructDataBitCount *)((long)pauVar1 + 0);
            field_02.proto._reader.pointerCount = *(StructPointerCount *)((long)pauVar1 + 4);
            field_02.proto._reader._38_2_ = *(undefined2 *)((long)pauVar1 + 6);
            field_02.proto._reader._40_8_ =
                 *(undefined8 *)(*(undefined1 (*) [12])((long)paVar21 + 0x30) + 8);
            DynamicStruct::Reader::get(&local_c0,&local_2f8,field_02);
            local_4c8.data = local_478._reader.pointers + 1;
            local_4c8.segment = (SegmentBuilder *)local_478._reader.segment;
            local_4c8.capTable = (CapTableBuilder *)local_478._reader.capTable;
            capnp::_::PointerBuilder::initStruct
                      (&local_230,(PointerBuilder *)&local_4c8,(StructSize)0x10002);
            field_03.index = (int)uStack_330;
            field_03.parent.super_Schema.raw = (Schema)(Schema)local_338;
            field_03._12_4_ = (int)((ulong)uStack_330 >> 0x20);
            field_03.proto._reader.segment._0_4_ = (int)local_328;
            field_03.proto._reader.segment._4_4_ = (int)((ulong)local_328 >> 0x20);
            field_03.proto._reader.capTable._0_4_ = (int)uStack_320;
            field_03.proto._reader.capTable._4_4_ = (int)((ulong)uStack_320 >> 0x20);
            field_03.proto._reader.data = (void *)local_318;
            field_03.proto._reader.pointers = (WirePointer *)uStack_310;
            field_03.proto._reader.dataSize = (undefined4)local_308;
            field_03.proto._reader.pointerCount = local_308._4_2_;
            field_03.proto._reader._38_2_ = local_308._6_2_;
            field_03.proto._reader._40_8_ = uStack_300;
            output_01._builder.capTable = local_230.capTable;
            output_01._builder.segment = local_230.segment;
            output_01._builder.data = local_230.data;
            output_01._builder.pointers = local_230.pointers;
            output_01._builder.dataSize = local_230.dataSize;
            output_01._builder.pointerCount = local_230.pointerCount;
            output_01._builder._38_2_ = local_230._38_2_;
            encodeField(local_440,field_03,&local_c0,output_01);
            DynamicValue::Reader::~Reader(&local_c0);
          }
          else {
            local_3d0.pointer = local_478._reader.pointers + 1;
            local_3d0.segment = (SegmentBuilder *)local_478._reader.segment;
            local_3d0.capTable = (CapTableBuilder *)local_478._reader.capTable;
            capnp::_::PointerBuilder::initStruct(&local_4c8,&local_3d0,(StructSize)0x10002);
            *(undefined2 *)&((WireValue<uint32_t> *)local_4c8.data)->value = 0;
          }
          if (local_558.ptr.isSet == true) {
            local_558.ptr.isSet = false;
          }
        }
        this = local_440;
        if (local_4a0[uVar17] == '\x01') {
          EVar16 = (ElementCount)local_568;
          local_568 = local_568 + 1;
          capnp::_::ListBuilder::getStructElement((StructBuilder *)&local_478,&local_208,EVar16);
          if (local_4d8._4_2_ == 0) {
            local_4c8.pointers._0_4_ = 0x7fffffff;
            local_4c8.capTable = (CapTableBuilder *)0x0;
            local_4c8.data = (void *)0x0;
            local_4c8.segment = (SegmentBuilder *)0x0;
          }
          else {
            local_4c8.data = pWStack_4e0;
            local_4c8.capTable = (CapTableBuilder *)pCStack_4f0;
            local_4c8.segment = (SegmentBuilder *)local_508._16_8_;
            local_4c8.pointers._0_4_ = (int)uStack_4d0;
          }
          RVar26 = capnp::_::PointerReader::getBlob<capnp::Text>
                             ((PointerReader *)&local_4c8,(void *)0x0,0);
          local_4c8.segment = (SegmentBuilder *)local_478._reader.segment;
          local_4c8.capTable = (CapTableBuilder *)local_478._reader.capTable;
          local_4c8.data = local_478._reader.pointers;
          capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_4c8,RVar26);
          local_378.raw = (RawBrandedSchema *)local_508._0_8_;
          pCStack_370 = (CapTableBuilder *)local_508._8_8_;
          local_368 = (SegmentBuilder *)local_508._16_8_;
          pCStack_360 = (CapTableBuilder *)pCStack_4f0;
          local_358 = local_4e8;
          pvStack_350 = pWStack_4e0;
          local_348 = local_4d8;
          uStack_340 = uStack_4d0;
          field_04.index = (int)local_508._8_8_;
          field_04.parent.super_Schema.raw = (Schema)(Schema)local_508._0_8_;
          field_04._12_4_ = SUB84(local_508._8_8_,4);
          field_04.proto._reader.segment._0_4_ = (int)local_508._16_8_;
          field_04.proto._reader.segment._4_4_ = SUB84(local_508._16_8_,4);
          field_04.proto._reader.capTable._0_4_ = (int)pCStack_4f0;
          field_04.proto._reader.capTable._4_4_ = (int)((ulong)pCStack_4f0 >> 0x20);
          field_04.proto._reader.data = local_4e8;
          field_04.proto._reader.pointers = pWStack_4e0;
          field_04.proto._reader.dataSize = (StructDataBitCount)local_4d8;
          field_04.proto._reader.pointerCount = local_4d8._4_2_;
          field_04.proto._reader._38_2_ = local_4d8._6_2_;
          field_04.proto._reader._40_8_ = uStack_4d0;
          DynamicStruct::Reader::get(&local_108,&local_2f8,field_04);
          local_4c8.data = local_478._reader.pointers + 1;
          local_4c8.segment = (SegmentBuilder *)local_478._reader.segment;
          local_4c8.capTable = (CapTableBuilder *)local_478._reader.capTable;
          capnp::_::PointerBuilder::initStruct
                    (&local_258,(PointerBuilder *)&local_4c8,(StructSize)0x10002);
          field_05.index = (int)pCStack_370;
          field_05.parent.super_Schema.raw = (Schema)(Schema)local_378.raw;
          field_05._12_4_ = (int)((ulong)pCStack_370 >> 0x20);
          field_05.proto._reader.segment._0_4_ = (int)local_368;
          field_05.proto._reader.segment._4_4_ = (int)((ulong)local_368 >> 0x20);
          field_05.proto._reader.capTable._0_4_ = (int)pCStack_360;
          field_05.proto._reader.capTable._4_4_ = (int)((ulong)pCStack_360 >> 0x20);
          field_05.proto._reader.data = local_358;
          field_05.proto._reader.pointers = (WirePointer *)pvStack_350;
          field_05.proto._reader.dataSize = (undefined4)local_348;
          field_05.proto._reader.pointerCount = local_348._4_2_;
          field_05.proto._reader._38_2_ = local_348._6_2_;
          field_05.proto._reader._40_8_ = uStack_340;
          output_02._builder.capTable = local_258.capTable;
          output_02._builder.segment = local_258.segment;
          output_02._builder.data = local_258.data;
          output_02._builder.pointers = local_258.pointers;
          output_02._builder.dataSize = local_258.dataSize;
          output_02._builder.pointerCount = local_258.pointerCount;
          output_02._builder._38_2_ = local_258._38_2_;
          encodeField(this,field_05,&local_108,output_02);
          DynamicValue::Reader::~Reader(&local_108);
        }
        uVar17 = uVar17 + 1;
      } while (local_3e8 != uVar17);
    }
    if (local_558.ptr.isSet != false) {
      local_508[7] = local_558.ptr.field_1.field1[7];
      local_508._0_7_ = local_558.ptr.field_1._0_7_;
      local_508._8_8_ = CONCAT44(local_558.ptr.field_1._12_4_,local_558.ptr.field_1.value.index);
      local_508._16_8_ = CONCAT17(local_558.ptr.field_1.field1[0x17],local_558.ptr.field_1._16_7_);
      pCStack_4f0 = (CapTableReader *)
                    CONCAT17(local_558.ptr.field_1.field1[0x1f],local_558.ptr.field_1._24_7_);
      local_4e8 = (WirePointer *)
                  CONCAT17(local_558.ptr.field_1.field1[0x27],local_558.ptr.field_1._32_7_);
      pWStack_4e0 = (WirePointer *)
                    CONCAT17(local_558.ptr.field_1.field1[0x2f],local_558.ptr.field_1._40_7_);
      local_4d8._7_1_ = local_558.ptr.field_1.field1[0x37];
      local_4d8._0_7_ = local_558.ptr.field_1._48_7_;
      uStack_4d0._7_1_ = local_558.ptr.field_1.field1[0x3f];
      uStack_4d0._0_7_ = local_558.ptr.field_1._56_7_;
      EVar16 = (ElementCount)local_568;
      local_568 = local_568 + 1;
      capnp::_::ListBuilder::getStructElement(&local_4c8,&local_208,EVar16);
      local_478._reader.dataSize = (StructDataBitCount)local_4d8;
      local_478._reader.pointerCount = local_4d8._4_2_;
      local_478._reader._38_2_ = local_4d8._6_2_;
      local_478._reader.nestingLimit = (int)uStack_4d0;
      local_478._reader._44_4_ = uStack_4d0._4_4_;
      local_478._reader.data = local_4e8;
      local_478._reader.pointers = pWStack_4e0;
      local_478._reader.segment = (SegmentReader *)local_508._16_8_;
      local_478._reader.capTable = pCStack_4f0;
      RVar26 = capnp::schema::Field::Reader::getName(&local_478);
      local_3d0.pointer = (WirePointer *)CONCAT44(local_4c8.pointers._4_4_,local_4c8.pointers._0_4_)
      ;
      local_3d0.segment = local_4c8.segment;
      local_3d0.capTable = local_4c8.capTable;
      capnp::_::PointerBuilder::setBlob<capnp::Text>(&local_3d0,RVar26);
      if ((char)local_55c == '\0') {
        local_388 = (StructDataBitCount)local_4d8;
        SStack_384 = local_4d8._4_2_;
        uStack_382 = local_4d8._6_2_;
        iStack_380 = (int)uStack_4d0;
        uStack_37c = uStack_4d0._4_4_;
        local_398 = local_4e8;
        pWStack_390 = pWStack_4e0;
        local_3a8 = (SegmentBuilder *)local_508._16_8_;
        pCStack_3a0 = pCStack_4f0;
        local_3b8.raw = (RawBrandedSchema *)local_508._0_8_;
        pCStack_3b0 = (CapTableBuilder *)local_508._8_8_;
        field_06.index = (int)local_508._8_8_;
        field_06.parent.super_Schema.raw = (Schema)(Schema)local_508._0_8_;
        field_06._12_4_ = SUB84(local_508._8_8_,4);
        field_06.proto._reader.segment._0_4_ = (int)local_508._16_8_;
        field_06.proto._reader.segment._4_4_ = SUB84(local_508._16_8_,4);
        field_06.proto._reader.capTable._0_4_ = (int)pCStack_4f0;
        field_06.proto._reader.capTable._4_4_ = (int)((ulong)pCStack_4f0 >> 0x20);
        field_06.proto._reader.data = local_4e8;
        field_06.proto._reader.pointers = pWStack_4e0;
        field_06.proto._reader.dataSize = (StructDataBitCount)local_4d8;
        field_06.proto._reader.pointerCount = local_4d8._4_2_;
        field_06.proto._reader._38_2_ = local_4d8._6_2_;
        field_06.proto._reader.nestingLimit = (int)uStack_4d0;
        field_06.proto._reader._44_4_ = uStack_4d0._4_4_;
        DynamicStruct::Reader::get(&local_1b8,&local_2f8,field_06);
        local_478._reader.data =
             (void *)(CONCAT44(local_4c8.pointers._4_4_,local_4c8.pointers._0_4_) + 8);
        local_478._reader.segment = &(local_4c8.segment)->super_SegmentReader;
        local_478._reader.capTable = &(local_4c8.capTable)->super_CapTableReader;
        capnp::_::PointerBuilder::initStruct
                  (&local_280,(PointerBuilder *)&local_478,(StructSize)0x10002);
        field_07.index = (int)pCStack_3b0;
        field_07.parent.super_Schema.raw = (Schema)(Schema)local_3b8.raw;
        field_07._12_4_ = (int)((ulong)pCStack_3b0 >> 0x20);
        field_07.proto._reader.segment._0_4_ = (int)local_3a8;
        field_07.proto._reader.segment._4_4_ = (int)((ulong)local_3a8 >> 0x20);
        field_07.proto._reader.capTable._0_4_ = (int)pCStack_3a0;
        field_07.proto._reader.capTable._4_4_ = (int)((ulong)pCStack_3a0 >> 0x20);
        field_07.proto._reader.data = local_398;
        field_07.proto._reader.pointers = pWStack_390;
        field_07.proto._reader.dataSize = local_388;
        field_07.proto._reader.pointerCount = SStack_384;
        field_07.proto._reader._38_2_ = uStack_382;
        field_07.proto._reader.nestingLimit = iStack_380;
        field_07.proto._reader._44_4_ = uStack_37c;
        output_03._builder.capTable = local_280.capTable;
        output_03._builder.segment = local_280.segment;
        output_03._builder.data = local_280.data;
        output_03._builder.pointers = local_280.pointers;
        output_03._builder.dataSize = local_280.dataSize;
        output_03._builder.pointerCount = local_280.pointerCount;
        output_03._builder._38_2_ = local_280._38_2_;
        encodeField(this,field_07,&local_1b8,output_03);
        DynamicValue::Reader::~Reader(&local_1b8);
      }
      else {
        local_3d0.pointer =
             (WirePointer *)(CONCAT44(local_4c8.pointers._4_4_,local_4c8.pointers._0_4_) + 8);
        local_3d0.segment = local_4c8.segment;
        local_3d0.capTable = local_4c8.capTable;
        capnp::_::PointerBuilder::initStruct
                  ((StructBuilder *)&local_478,&local_3d0,(StructSize)0x10002);
        *(undefined2 *)&((WireValue<uint32_t> *)local_478._reader.data)->value = 0;
      }
    }
    uVar17 = uStack_490;
    puVar11 = local_498;
    local_508._8_8_ = local_56c;
    local_508._0_8_ = &local_568;
    local_508._16_8_ = " == ";
    pCStack_4f0 = (CapTableReader *)0x5;
    local_4e8 = (WirePointer *)CONCAT71(local_4e8._1_7_,local_568 == (uint)local_56c);
    if (local_568 != (uint)local_56c) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_int&>&>
                ((Fault *)&local_478,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x16a,FAILED,"pos == fieldCount","_kjCondition,",
                 (DebugComparison<unsigned_long_&,_unsigned_int_&> *)local_508);
      kj::_::Debug::Fault::fatal((Fault *)&local_478);
    }
    if (local_498 != (undefined1 *)0x0) {
      local_498 = (undefined1 *)0x0;
      uStack_490 = 0;
      (**(code **)*local_488)(local_488,puVar11,1,uVar17,uVar17,0);
    }
    break;
  case INTERFACE:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[90]>
              ((Fault *)local_438,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x16f,FAILED,(char *)0x0,
               "\"don\'t know how to JSON-encode capabilities; \" \"please register a JsonCodec::Handler for this\""
               ,(char (*) [90])
                "don\'t know how to JSON-encode capabilities; please register a JsonCodec::Handler for this"
              );
    kj::_::Debug::Fault::fatal((Fault *)local_438);
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[88]>
              ((Fault *)local_438,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x172,FAILED,(char *)0x0,
               "\"don\'t know how to JSON-encode AnyPointer; \" \"please register a JsonCodec::Handler for this\""
               ,(char (*) [88])
                "don\'t know how to JSON-encode AnyPointer; please register a JsonCodec::Handler for this"
              );
    kj::_::Debug::Fault::fatal((Fault *)local_438);
  }
  return;
}

Assistant:

void JsonCodec::encode(DynamicValue::Reader input, Type type, JsonValue::Builder output) const {
  // TODO(someday): For interfaces, check for handlers on superclasses, per documentation...
  // TODO(someday): For branded types, should we check for handlers on the generic?
  // TODO(someday): Allow registering handlers for "all structs", "all lists", etc?
  KJ_IF_SOME(handler, impl->typeHandlers.find(type)) {
    handler->encodeBase(*this, input, output);
    return;
  }

  switch (type.which()) {
    case schema::Type::VOID:
      output.setNull();
      break;
    case schema::Type::BOOL:
      output.setBoolean(input.as<bool>());
      break;
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
      output.setNumber(input.as<double>());
      break;
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
      {
        double value = input.as<double>();
        // Inf, -inf and NaN are not allowed in the JSON spec. Storing into string.
        if (kj::inf() == value) {
          output.setString("Infinity");
        } else if (-kj::inf() == value) {
          output.setString("-Infinity");
        } else if (kj::isNaN(value)) {
          output.setString("NaN");
        } else {
          output.setNumber(value);
        }
      }
      break;
    case schema::Type::INT64:
      output.setString(kj::str(input.as<int64_t>()));
      break;
    case schema::Type::UINT64:
      output.setString(kj::str(input.as<uint64_t>()));
      break;
    case schema::Type::TEXT:
      output.setString(kj::str(input.as<Text>()));
      break;
    case schema::Type::DATA: {
      // Turn into array of byte values. Yep, this is pretty ugly. People really need to override
      // this with a handler.
      auto bytes = input.as<Data>();
      auto array = output.initArray(bytes.size());
      for (auto i: kj::indices(bytes)) {
        array[i].setNumber(bytes[i]);
      }
      break;
    }
    case schema::Type::LIST: {
      auto list = input.as<DynamicList>();
      auto elementType = type.asList().getElementType();
      auto array = output.initArray(list.size());
      for (auto i: kj::indices(list)) {
        encode(list[i], elementType, array[i]);
      }
      break;
    }
    case schema::Type::ENUM: {
      auto e = input.as<DynamicEnum>();
      KJ_IF_SOME(symbol, e.getEnumerant()) {
        output.setString(symbol.getProto().getName());
      } else {
        output.setNumber(e.getRaw());
      }
      break;
    }
    case schema::Type::STRUCT: {
      auto structValue = input.as<capnp::DynamicStruct>();
      auto nonUnionFields = structValue.getSchema().getNonUnionFields();

      KJ_STACK_ARRAY(bool, hasField, nonUnionFields.size(), 32, 128);

      uint fieldCount = 0;
      for (auto i: kj::indices(nonUnionFields)) {
        fieldCount += (hasField[i] = structValue.has(nonUnionFields[i], impl->hasMode));
      }

      // We try to write the union field, if any, in proper order with the rest.
      auto which = structValue.which();
      bool unionFieldIsNull = false;

      KJ_IF_SOME(field, which) {
        // Even if the union field is null, if it is not the default field of the union then we
        // have to print it anyway.
        unionFieldIsNull = !structValue.has(field, impl->hasMode);
        if (field.getProto().getDiscriminantValue() != 0 || !unionFieldIsNull) {
          ++fieldCount;
        } else {
          which = kj::none;
        }
      }

      auto object = output.initObject(fieldCount);

      size_t pos = 0;
      for (auto i: kj::indices(nonUnionFields)) {
        auto field = nonUnionFields[i];
        KJ_IF_SOME(unionField, which) {
          if (unionField.getIndex() < field.getIndex()) {
            auto outField = object[pos++];
            outField.setName(unionField.getProto().getName());
            if (unionFieldIsNull) {
              outField.initValue().setNull();
            } else {
              encodeField(unionField, structValue.get(unionField), outField.initValue());
            }
            which = kj::none;
          }
        }
        if (hasField[i]) {
          auto outField = object[pos++];
          outField.setName(field.getProto().getName());
          encodeField(field, structValue.get(field), outField.initValue());
        }
      }
      if (which != kj::none) {
        // Union field not printed yet; must be last.
        auto unionField = KJ_ASSERT_NONNULL(which);
        auto outField = object[pos++];
        outField.setName(unionField.getProto().getName());
        if (unionFieldIsNull) {
          outField.initValue().setNull();
        } else {
          encodeField(unionField, structValue.get(unionField), outField.initValue());
        }
      }
      KJ_ASSERT(pos == fieldCount);
      break;
    }
    case schema::Type::INTERFACE:
      KJ_FAIL_REQUIRE("don't know how to JSON-encode capabilities; "
                      "please register a JsonCodec::Handler for this");
    case schema::Type::ANY_POINTER:
      KJ_FAIL_REQUIRE("don't know how to JSON-encode AnyPointer; "
                      "please register a JsonCodec::Handler for this");
  }